

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

_Bool translateOperand(MCInst *mcInst,OperandSpecifier *operand,InternalInstruction *insn)

{
  byte bVar1;
  InternalInstruction *insn_local;
  OperandSpecifier *operand_local;
  MCInst *mcInst_local;
  
  switch(operand->encoding) {
  case '\x01':
    translateRegister(mcInst,insn->reg);
    mcInst_local._7_1_ = false;
    break;
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
    mcInst_local._7_1_ = translateRM(mcInst,operand,insn);
    break;
  case '\t':
    translateRegister(mcInst,insn->vvvv);
    mcInst_local._7_1_ = false;
    break;
  case '\n':
    mcInst_local._7_1_ = translateMaskRegister(mcInst,(uint8_t)insn->writemask);
    break;
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
    mcInst_local._7_1_ = true;
    break;
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x1a':
  case '\x1b':
    bVar1 = insn->numImmediatesTranslated;
    insn->numImmediatesTranslated = bVar1 + 1;
    translateImmediate(mcInst,insn->immediates[bVar1],operand,insn);
    mcInst_local._7_1_ = false;
    break;
  case '\x15':
  case '\x16':
  case '\x17':
  case '\x18':
  case '\x1c':
    translateRegister(mcInst,insn->opcodeRegister);
    mcInst_local._7_1_ = false;
    break;
  case '\x19':
    translateFPRegister(mcInst,insn->modRM & 7);
    mcInst_local._7_1_ = false;
    break;
  case '\x1d':
    mcInst_local._7_1_ = translateOperand(mcInst,insn->operands + (int)(operand->type - 0x51),insn);
    break;
  case '\x1e':
    mcInst_local._7_1_ = translateSrcIndex(mcInst,insn);
    break;
  case '\x1f':
    mcInst_local._7_1_ = translateDstIndex(mcInst,insn);
    break;
  default:
    mcInst_local._7_1_ = true;
  }
  return mcInst_local._7_1_;
}

Assistant:

static bool translateOperand(MCInst *mcInst, const OperandSpecifier *operand, InternalInstruction *insn)
{
	switch (operand->encoding) {
		case ENCODING_REG:
			translateRegister(mcInst, insn->reg);
			return false;
		case ENCODING_WRITEMASK:
			return translateMaskRegister(mcInst, insn->writemask);
		CASE_ENCODING_RM:
			return translateRM(mcInst, operand, insn);
		case ENCODING_CB:
		case ENCODING_CW:
		case ENCODING_CD:
		case ENCODING_CP:
		case ENCODING_CO:
		case ENCODING_CT:
			//debug("Translation of code offsets isn't supported.");
			return true;
		case ENCODING_IB:
		case ENCODING_IW:
		case ENCODING_ID:
		case ENCODING_IO:
		case ENCODING_Iv:
		case ENCODING_Ia:
			translateImmediate(mcInst, insn->immediates[insn->numImmediatesTranslated++], operand, insn);
			return false;
		case ENCODING_SI:
			return translateSrcIndex(mcInst, insn);
		case ENCODING_DI:
			return translateDstIndex(mcInst, insn);
		case ENCODING_RB:
		case ENCODING_RW:
		case ENCODING_RD:
		case ENCODING_RO:
		case ENCODING_Rv:
			translateRegister(mcInst, insn->opcodeRegister);
			return false;
		case ENCODING_FP:
			translateFPRegister(mcInst, insn->modRM & 7);
			return false;
		case ENCODING_VVVV:
			translateRegister(mcInst, insn->vvvv);
			return false;
		case ENCODING_DUP:
			return translateOperand(mcInst, &insn->operands[operand->type - TYPE_DUP0], insn);
		default:
			//debug("Unhandled operand encoding during translation");
			return true;
	}
}